

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitrate.c
# Opt level: O2

int vorbis_bitrate_addblock(vorbis_block *vb)

{
  void *pvVar1;
  vorbis_info *pvVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  long local_68;
  int local_60;
  
  pvVar1 = vb->internal;
  pvVar2 = vb->vd->vi;
  pvVar3 = vb->vd->backend_state;
  pvVar4 = pvVar2->codec_setup;
  dVar16 = rint(*(double *)((long)pvVar3 + 200));
  uVar13 = (uint)dVar16;
  uVar14 = (ulong)uVar13;
  uVar6 = (ulong)(int)uVar13;
  lVar7 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + uVar6 * 8 + 0x10));
  lVar8 = vb->W;
  lVar9 = *(long *)((long)pvVar3 + 0xb0);
  if (lVar8 == 0) {
    local_68 = *(long *)((long)pvVar3 + 0xb8);
    lVar12 = lVar9;
  }
  else {
    local_68 = *(long *)((long)pvVar3 + 0xc0) * *(long *)((long)pvVar3 + 0xb8);
    lVar12 = *(long *)((long)pvVar3 + 0xc0) * lVar9;
  }
  if (*(int *)((long)pvVar3 + 0x90) == 0) {
    if (*(long *)((long)pvVar3 + 0xd0) != 0) {
      return -1;
    }
    *(vorbis_block **)((long)pvVar3 + 0xd0) = vb;
    return 0;
  }
  puVar11 = (undefined8 *)((long)pvVar1 + 0x10);
  lVar7 = lVar7 * 8;
  lVar10 = (long)((double)*(long *)((long)pvVar4 + 0x1558) * *(double *)((long)pvVar4 + 0x1560));
  uVar5 = *(ulong *)((long)pvVar4 + lVar8 * 8);
  *(vorbis_block **)((long)pvVar3 + 0xd0) = vb;
  lVar15 = *(long *)((long)pvVar3 + 0xa8);
  if (0 < lVar15) {
    if (lVar8 != 0) {
      lVar15 = lVar15 * *(long *)((long)pvVar3 + 0xc0);
    }
    dVar16 = 15.0 / *(double *)((long)pvVar4 + 0x1568);
    lVar8 = (lVar7 - lVar15) + *(long *)((long)pvVar3 + 0x98);
    if (lVar10 < lVar8) {
      uVar14 = (ulong)uVar13;
      for (; ((0 < (int)uVar14 && (lVar7 - lVar15 != 0 && lVar15 <= lVar7)) &&
             (lVar10 < (lVar7 - lVar15) + *(long *)((long)pvVar3 + 0x98))); lVar7 = lVar7 << 3) {
        lVar8 = uVar14 * 8;
        uVar14 = uVar14 - 1;
        lVar7 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + lVar8 + 8));
      }
    }
    else if (lVar8 < lVar10) {
      for (; ((uVar14 = uVar6, (long)uVar6 < 0xe && (lVar7 < lVar15)) &&
             ((lVar7 - lVar15) + *(long *)((long)pvVar3 + 0x98) < lVar10)); lVar7 = lVar7 << 3) {
        lVar7 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + uVar6 * 8 + 0x18));
        uVar6 = uVar6 + 1;
      }
    }
    dVar20 = *(double *)((long)pvVar3 + 200);
    dVar17 = rint((double)(int)uVar14 - dVar20);
    local_60 = (int)(uVar5 >> 1);
    dVar19 = (double)pvVar2->rate;
    dVar18 = (dVar17 / (double)local_60) * dVar19;
    dVar17 = -dVar16;
    if (-dVar16 <= dVar18) {
      dVar17 = dVar18;
    }
    if (dVar17 <= dVar16) {
      dVar16 = dVar17;
    }
    dVar20 = (dVar16 / dVar19) * (double)local_60 + dVar20;
    *(double *)((long)pvVar3 + 200) = dVar20;
    dVar16 = rint(dVar20);
    uVar14 = (ulong)(uint)(int)dVar16;
    lVar7 = oggpack_bytes((oggpack_buffer *)puVar11[(int)dVar16]);
    lVar7 = lVar7 << 3;
    lVar9 = *(long *)((long)pvVar3 + 0xb0);
  }
  if ((0 < lVar9) && (lVar7 < lVar12)) {
    uVar14 = (ulong)(int)uVar14;
    for (; (lVar7 - lVar12) + *(long *)((long)pvVar3 + 0xa0) < 0; lVar7 = lVar7 << 3) {
      if (0xd < (long)uVar14) {
        uVar14 = uVar14 + 1;
        break;
      }
      lVar7 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + uVar14 * 8 + 0x18));
      uVar14 = uVar14 + 1;
    }
  }
  if ((0 < *(long *)((long)pvVar3 + 0xb8)) && (local_68 < lVar7)) {
    uVar14 = uVar14 & 0xffffffff;
    while( true ) {
      lVar8 = *(long *)((long)pvVar3 + 0xa0);
      lVar9 = *(long *)((long)pvVar4 + 0x1558);
      if ((lVar7 - local_68) + lVar8 <= lVar9) break;
      if ((int)uVar14 < 1) goto LAB_001bb291;
      lVar8 = uVar14 * 8;
      uVar14 = uVar14 - 1;
      lVar7 = oggpack_bytes(*(oggpack_buffer **)((long)pvVar1 + lVar8 + 8));
      lVar7 = lVar7 << 3;
    }
  }
  if ((int)(uint)uVar14 < 0) {
    lVar9 = *(long *)((long)pvVar4 + 0x1558);
    lVar8 = *(long *)((long)pvVar3 + 0xa0);
LAB_001bb291:
    lVar8 = ((lVar9 + local_68) - lVar8) / 8;
    *(undefined4 *)((long)pvVar3 + 0xd8) = 0;
    lVar9 = oggpack_bytes((oggpack_buffer *)*puVar11);
    if (lVar8 < lVar9) {
      oggpack_writetrunc((oggpack_buffer *)*puVar11,lVar8 << 3);
      goto LAB_001bb2c7;
    }
  }
  else {
    lVar8 = *(long *)((long)pvVar3 + 0xa0);
    uVar6 = 0xe;
    if ((uint)uVar14 < 0xe) {
      uVar6 = uVar14;
    }
    *(int *)((long)pvVar3 + 0xd8) = (int)uVar6;
    puVar11 = puVar11 + (uVar6 & 0xffffffff);
    lVar9 = oggpack_bytes((oggpack_buffer *)*puVar11);
    for (lVar9 = ((lVar12 - lVar8) + 7) / 8 - lVar9; 0 < lVar9; lVar9 = lVar9 + -1) {
      oggpack_write((oggpack_buffer *)*puVar11,0,8);
    }
LAB_001bb2c7:
    lVar7 = oggpack_bytes((oggpack_buffer *)*puVar11);
    lVar7 = lVar7 << 3;
  }
  if ((*(long *)((long)pvVar3 + 0xb0) < 1) && (*(long *)((long)pvVar3 + 0xb8) < 1))
  goto LAB_001bb31d;
  if (((0 < local_68) && (lVar8 = lVar7 - local_68, lVar8 != 0 && local_68 <= lVar7)) ||
     ((0 < lVar12 && (lVar8 = lVar7 - lVar12, lVar7 < lVar12)))) {
    *(long *)((long)pvVar3 + 0xa0) = *(long *)((long)pvVar3 + 0xa0) + lVar8;
    goto LAB_001bb31d;
  }
  lVar8 = *(long *)((long)pvVar3 + 0xa0);
  if (lVar10 < lVar8) {
    if (local_68 < 1) {
LAB_001bb3b1:
      *(long *)((long)pvVar3 + 0xa0) = lVar10;
      goto LAB_001bb31d;
    }
    lVar8 = (lVar7 - local_68) + lVar8;
    if (lVar8 <= lVar10) {
      lVar8 = lVar10;
    }
  }
  else {
    if (lVar12 < 1) goto LAB_001bb3b1;
    lVar8 = (lVar7 - lVar12) + lVar8;
    if (lVar10 <= lVar8) {
      lVar8 = lVar10;
    }
  }
  *(long *)((long)pvVar3 + 0xa0) = lVar8;
LAB_001bb31d:
  lVar8 = *(long *)((long)pvVar3 + 0xa8);
  if (0 < lVar8) {
    if (vb->W != 0) {
      lVar8 = lVar8 * *(long *)((long)pvVar3 + 0xc0);
    }
    *(long *)((long)pvVar3 + 0x98) = *(long *)((long)pvVar3 + 0x98) + (lVar7 - lVar8);
  }
  return 0;
}

Assistant:

int vorbis_bitrate_addblock(vorbis_block *vb){
  vorbis_block_internal *vbi=vb->internal;
  vorbis_dsp_state      *vd=vb->vd;
  private_state         *b=vd->backend_state;
  bitrate_manager_state *bm=&b->bms;
  vorbis_info           *vi=vd->vi;
  codec_setup_info      *ci=vi->codec_setup;
  bitrate_manager_info  *bi=&ci->bi;

  int  choice=rint(bm->avgfloat);
  long this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  long min_target_bits=(vb->W?bm->min_bitsper*bm->short_per_long:bm->min_bitsper);
  long max_target_bits=(vb->W?bm->max_bitsper*bm->short_per_long:bm->max_bitsper);
  int  samples=ci->blocksizes[vb->W]>>1;
  long desired_fill=bi->reservoir_bits*bi->reservoir_bias;
  if(!bm->managed){
    /* not a bitrate managed stream, but for API simplicity, we'll
       buffer the packet to keep the code path clean */

    if(bm->vb)return(-1); /* one has been submitted without
                             being claimed */
    bm->vb=vb;
    return(0);
  }

  bm->vb=vb;

  /* look ahead for avg floater */
  if(bm->avg_bitsper>0){
    double slew=0.;
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    double slewlimit= 15./bi->slew_damp;

    /* choosing a new floater:
       if we're over target, we slew down
       if we're under target, we slew up

       choose slew as follows: look through packetblobs of this frame
       and set slew as the first in the appropriate direction that
       gives us the slew we want.  This may mean no slew if delta is
       already favorable.

       Then limit slew to slew max */

    if(bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
      while(choice>0 && this_bits>avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)>desired_fill){
        choice--;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }else if(bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
      while(choice+1<PACKETBLOBS && this_bits<avg_target_bits &&
            bm->avg_reservoir+(this_bits-avg_target_bits)<desired_fill){
        choice++;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }

    slew=rint(choice-bm->avgfloat)/samples*vi->rate;
    if(slew<-slewlimit)slew=-slewlimit;
    if(slew>slewlimit)slew=slewlimit;
    choice=rint(bm->avgfloat+= slew/vi->rate*samples);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
  }



  /* enforce min(if used) on the current floater (if used) */
  if(bm->min_bitsper>0){
    /* do we need to force the bitrate up? */
    if(this_bits<min_target_bits){
      while(bm->minmax_reservoir-(min_target_bits-this_bits)<0){
        choice++;
        if(choice>=PACKETBLOBS)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* enforce max (if used) on the current floater (if used) */
  if(bm->max_bitsper>0){
    /* do we need to force the bitrate down? */
    if(this_bits>max_target_bits){
      while(bm->minmax_reservoir+(this_bits-max_target_bits)>bi->reservoir_bits){
        choice--;
        if(choice<0)break;
        this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
      }
    }
  }

  /* Choice of packetblobs now made based on floater, and min/max
     requirements. Now boundary check extreme choices */

  if(choice<0){
    /* choosing a smaller packetblob is insufficient to trim bitrate.
       frame will need to be truncated */
    long maxsize=(max_target_bits+(bi->reservoir_bits-bm->minmax_reservoir))/8;
    bm->choice=choice=0;

    if(oggpack_bytes(vbi->packetblob[choice])>maxsize){

      oggpack_writetrunc(vbi->packetblob[choice],maxsize*8);
      this_bits=oggpack_bytes(vbi->packetblob[choice])*8;
    }
  }else{
    long minsize=(min_target_bits-bm->minmax_reservoir+7)/8;
    if(choice>=PACKETBLOBS)
      choice=PACKETBLOBS-1;

    bm->choice=choice;

    /* prop up bitrate according to demand. pad this frame out with zeroes */
    minsize-=oggpack_bytes(vbi->packetblob[choice]);
    while(minsize-->0)oggpack_write(vbi->packetblob[choice],0,8);
    this_bits=oggpack_bytes(vbi->packetblob[choice])*8;

  }

  /* now we have the final packet and the final packet size.  Update statistics */
  /* min and max reservoir */
  if(bm->min_bitsper>0 || bm->max_bitsper>0){

    if(max_target_bits>0 && this_bits>max_target_bits){
      bm->minmax_reservoir+=(this_bits-max_target_bits);
    }else if(min_target_bits>0 && this_bits<min_target_bits){
      bm->minmax_reservoir+=(this_bits-min_target_bits);
    }else{
      /* inbetween; we want to take reservoir toward but not past desired_fill */
      if(bm->minmax_reservoir>desired_fill){
        if(max_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-max_target_bits);
          if(bm->minmax_reservoir<desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }else{
        if(min_target_bits>0){ /* logical bulletproofing against initialization state */
          bm->minmax_reservoir+=(this_bits-min_target_bits);
          if(bm->minmax_reservoir>desired_fill)bm->minmax_reservoir=desired_fill;
        }else{
          bm->minmax_reservoir=desired_fill;
        }
      }
    }
  }

  /* avg reservoir */
  if(bm->avg_bitsper>0){
    long avg_target_bits=(vb->W?bm->avg_bitsper*bm->short_per_long:bm->avg_bitsper);
    bm->avg_reservoir+=this_bits-avg_target_bits;
  }

  return(0);
}